

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

BinaryExpr * new_binary_expr(void *left,Token *op,void *right)

{
  Token *pTVar1;
  void *any;
  BinaryExpr *pBVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x20);
  pBVar2 = (BinaryExpr *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node(op,binary_eval);
  pTVar1 = pTVar3->token;
  (pBVar2->node).eval = pTVar3->eval;
  (pBVar2->node).token = pTVar1;
  pBVar2->left = left;
  pBVar2->right = right;
  return pBVar2;
}

Assistant:

BinaryExpr *new_binary_expr(void *left, Token *op, void *right) {
    BinaryExpr *expr = new(BinaryExpr);
    expr->node = tree_node_(op, eval_handler(binary_eval));
    expr->left = left;
    expr->right = right;
    return expr;
}